

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O2

void stbir__encode_uint16_linear_BGRA(void *outputp,int width_times_channels,float *encode)

{
  float *pfVar1;
  short *psVar2;
  float *pfVar3;
  short *psVar4;
  float fVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  undefined1 auVar12 [16];
  float *pfVar13;
  float *pfVar14;
  short *psVar15;
  short *psVar16;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  short sVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  
  auVar12 = _DAT_0049a880;
  psVar4 = (short *)((long)outputp + (long)width_times_channels * 2);
  if (width_times_channels < 8) {
    for (psVar15 = (short *)((long)outputp + 8); psVar15 <= psVar4; psVar15 = psVar15 + 4) {
      auVar18._0_4_ = encode[2] + 0.5;
      auVar18._4_4_ = encode[1] + 0.5;
      auVar18._8_4_ = *encode + 0.5;
      auVar18._12_4_ = encode[3] + 0.5;
      auVar18 = minps(auVar18,auVar12);
      auVar18 = maxps(auVar18,ZEXT816(0));
      auVar28._0_4_ = (int)auVar18._0_4_ - (int)stbir__s32_32768[0];
      auVar28._4_4_ = (int)auVar18._4_4_ - stbir__s32_32768[0]._4_4_;
      auVar28._8_4_ = (int)auVar18._8_4_ - (int)stbir__s32_32768[1];
      auVar28._12_4_ = (int)auVar18._12_4_ - stbir__s32_32768[1]._4_4_;
      auVar18 = packssdw(auVar28,auVar28);
      *(ulong *)(psVar15 + -4) =
           CONCAT26(auVar18._6_2_ - stbir__s16_32768[0]._6_2_,
                    CONCAT24(auVar18._4_2_ - stbir__s16_32768[0]._4_2_,
                             CONCAT22(auVar18._2_2_ - stbir__s16_32768[0]._2_2_,
                                      auVar18._0_2_ - (short)stbir__s16_32768[0])));
      encode = encode + 4;
    }
  }
  else {
    pfVar13 = encode + (long)width_times_channels + -8;
    psVar15 = psVar4 + -8;
    do {
      pfVar1 = encode + 8;
      psVar2 = (short *)((long)outputp + 0x10);
      psVar16 = psVar15;
      if (psVar2 == psVar4) {
        psVar16 = psVar2;
      }
      fVar5 = *encode;
      pfVar6 = encode + 1;
      pfVar7 = encode + 2;
      pfVar8 = encode + 3;
      pfVar14 = pfVar13;
      if (psVar2 == psVar4) {
        pfVar14 = pfVar1;
      }
      if (psVar2 <= psVar15) {
        psVar16 = psVar2;
      }
      pfVar3 = encode + 4;
      pfVar9 = encode + 5;
      pfVar10 = encode + 6;
      pfVar11 = encode + 7;
      encode = pfVar14;
      if (psVar2 <= psVar15) {
        encode = pfVar1;
      }
      auVar17._0_4_ = *pfVar7 + 0.5;
      auVar17._4_4_ = *pfVar6 + 0.5;
      auVar17._8_4_ = fVar5 + 0.5;
      auVar17._12_4_ = *pfVar8 + 0.5;
      auVar27._0_4_ = *pfVar10 + 0.5;
      auVar27._4_4_ = *pfVar9 + 0.5;
      auVar27._8_4_ = *pfVar3 + 0.5;
      auVar27._12_4_ = *pfVar11 + 0.5;
      auVar18 = minps(auVar17,auVar12);
      auVar18 = maxps(auVar18,ZEXT816(0));
      auVar28 = minps(auVar27,auVar12);
      auVar28 = maxps(auVar28,ZEXT816(0));
      auVar19._0_4_ = (int)auVar18._0_4_ - (int)stbir__s32_32768[0];
      auVar19._4_4_ = (int)auVar18._4_4_ - stbir__s32_32768[0]._4_4_;
      auVar19._8_4_ = (int)auVar18._8_4_ - (int)stbir__s32_32768[1];
      auVar19._12_4_ = (int)auVar18._12_4_ - stbir__s32_32768[1]._4_4_;
      auVar29._0_4_ = (int)auVar28._0_4_ - (int)stbir__s32_32768[0];
      auVar29._4_4_ = (int)auVar28._4_4_ - stbir__s32_32768[0]._4_4_;
      auVar29._8_4_ = (int)auVar28._8_4_ - (int)stbir__s32_32768[1];
      auVar29._12_4_ = (int)auVar28._12_4_ - stbir__s32_32768[1]._4_4_;
      auVar18 = packssdw(auVar19,auVar29);
      sVar20 = auVar18._2_2_ - stbir__s16_32768[0]._2_2_;
      sVar21 = auVar18._4_2_ - stbir__s16_32768[0]._4_2_;
      sVar22 = auVar18._6_2_ - stbir__s16_32768[0]._6_2_;
      sVar23 = auVar18._8_2_ - (short)stbir__s16_32768[1];
      sVar24 = auVar18._10_2_ - stbir__s16_32768[1]._2_2_;
      sVar25 = auVar18._12_2_ - stbir__s16_32768[1]._4_2_;
      sVar26 = auVar18._14_2_ - stbir__s16_32768[1]._6_2_;
      *(short *)outputp = auVar18._0_2_ - (short)stbir__s16_32768[0];
      *(short *)((long)outputp + 2) = sVar20;
      *(short *)((long)outputp + 4) = sVar21;
      *(short *)((long)outputp + 6) = sVar22;
      *(short *)((long)outputp + 8) = sVar23;
      *(short *)((long)outputp + 10) = sVar24;
      *(short *)((long)outputp + 0xc) = sVar25;
      *(short *)((long)outputp + 0xe) = sVar26;
      outputp = psVar16;
    } while (psVar2 != psVar4);
  }
  return;
}

Assistant:

static void STBIR__CODER_NAME(stbir__encode_uint16_linear)( void * outputp, int width_times_channels, float const * encode )
{
  unsigned short STBIR_SIMD_STREAMOUT_PTR( * ) output = (unsigned short*) outputp;
  unsigned short * end_output = ( (unsigned short*) output ) + width_times_channels;

  #ifdef STBIR_SIMD
  {
    if ( width_times_channels >= stbir__simdfX_float_count*2 )
    {
      float const * end_encode_m8 = encode + width_times_channels - stbir__simdfX_float_count*2;
      end_output -= stbir__simdfX_float_count*2;
      STBIR_SIMD_NO_UNROLL_LOOP_START_INF_FOR
      for(;;)
      {
        stbir__simdfX e0, e1;
        stbir__simdiX i;
        STBIR_SIMD_NO_UNROLL(encode);
        stbir__simdfX_add_mem( e0, STBIR_simd_point5X, encode );
        stbir__simdfX_add_mem( e1, STBIR_simd_point5X, encode+stbir__simdfX_float_count );
        stbir__encode_simdfX_unflip( e0 );
        stbir__encode_simdfX_unflip( e1 );
        stbir__simdfX_pack_to_words( i, e0, e1 );
        stbir__simdiX_store( output, i );
        encode += stbir__simdfX_float_count*2;
        output += stbir__simdfX_float_count*2;
        if ( output <= end_output )
          continue;
        if ( output == ( end_output + stbir__simdfX_float_count*2 ) )
          break;
        output = end_output; // backup and do last couple
        encode = end_encode_m8;
      }
      return;
    }
  }

  // try to do blocks of 4 when you can
  #if stbir__coder_min_num != 3 // doesn't divide cleanly by four
  output += 4;
  STBIR_NO_UNROLL_LOOP_START
  while( output <= end_output )
  {
    stbir__simdf e;
    stbir__simdi i;
    STBIR_NO_UNROLL(encode);
    stbir__simdf_load( e, encode );
    stbir__simdf_add( e, STBIR__CONSTF(STBIR_simd_point5), e );
    stbir__encode_simdf4_unflip( e );
    stbir__simdf_pack_to_8words( i, e, e );  // only use first 4
    stbir__simdi_store2( output-4, i );
    output += 4;
    encode += 4;
  }
  output -= 4;
  #endif

  #else

  // try to do blocks of 4 when you can
  #if  stbir__coder_min_num != 3 // doesn't divide cleanly by four
  output += 4;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  while( output <= end_output )
  {
    float f;
    STBIR_SIMD_NO_UNROLL(encode);
    f = encode[stbir__encode_order0] + 0.5f; STBIR_CLAMP(f, 0, 65535); output[0-4] = (unsigned short)f;
    f = encode[stbir__encode_order1] + 0.5f; STBIR_CLAMP(f, 0, 65535); output[1-4] = (unsigned short)f;
    f = encode[stbir__encode_order2] + 0.5f; STBIR_CLAMP(f, 0, 65535); output[2-4] = (unsigned short)f;
    f = encode[stbir__encode_order3] + 0.5f; STBIR_CLAMP(f, 0, 65535); output[3-4] = (unsigned short)f;
    output += 4;
    encode += 4;
  }
  output -= 4;
  #endif

  #endif

  // do the remnants
  #if stbir__coder_min_num < 4
  STBIR_NO_UNROLL_LOOP_START
  while( output < end_output )
  {
    float f;
    STBIR_NO_UNROLL(encode);
    f = encode[stbir__encode_order0] + 0.5f; STBIR_CLAMP(f, 0, 65535); output[0] = (unsigned short)f;
    #if stbir__coder_min_num >= 2
    f = encode[stbir__encode_order1] + 0.5f; STBIR_CLAMP(f, 0, 65535); output[1] = (unsigned short)f;
    #endif
    #if stbir__coder_min_num >= 3
    f = encode[stbir__encode_order2] + 0.5f; STBIR_CLAMP(f, 0, 65535); output[2] = (unsigned short)f;
    #endif
    output += stbir__coder_min_num;
    encode += stbir__coder_min_num;
  }
  #endif
}